

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

uint __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
::bubbleUp(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>_>
           *this,uint index)

{
  Comparison CVar1;
  uint in_ESI;
  Binding *in_RDI;
  uint nextIndex;
  Binding *in_stack_ffffffffffffffd8;
  uint local_18;
  uint local_14;
  
  local_18 = in_ESI >> 1;
  local_14 = in_ESI;
  while( true ) {
    if (local_18 == 0) {
      return 1;
    }
    CVar1 = Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Lhs>::compare
                      (in_RDI,in_stack_ffffffffffffffd8);
    if (CVar1 != LESS) break;
    std::swap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Binding>
              ((Binding *)(*(long *)(in_RDI + 1) + (ulong)local_14 * 0x10),
               (Binding *)(*(long *)(in_RDI + 1) + (ulong)local_18 * 0x10));
    local_14 = local_18;
    local_18 = local_18 >> 1;
  }
  return local_14;
}

Assistant:

unsigned bubbleUp(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index>>1;
    while(nextIndex) {
      if(Comparator::compare(_data1[index], _data1[nextIndex])==LESS) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index>>1;
    }
    return 1;
  }